

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetCursorPos(ImVec2 *local_pos)

{
  ImGuiWindow *pIVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  IVar6 = (pIVar1->DC).CursorMaxPos;
  fVar4 = IVar6.x;
  fVar5 = IVar6.y;
  IVar6.x = (*local_pos).x + ((pIVar1->Pos).x - (pIVar1->Scroll).x);
  IVar6.y = (*local_pos).y + ((pIVar1->Pos).y - (pIVar1->Scroll).y);
  (pIVar1->DC).CursorPos = IVar6;
  uVar2 = -(uint)(IVar6.x <= fVar4);
  uVar3 = -(uint)(IVar6.y <= fVar5);
  (pIVar1->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar3 & (uint)IVar6.y,~uVar2 & (uint)IVar6.x) |
               CONCAT44((uint)fVar5 & uVar3,(uint)fVar4 & uVar2));
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }